

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.cpp
# Opt level: O0

void __thiscall
WordSplitSVTest_single_word_prefix_delim_Test<unsigned_char>::
WordSplitSVTest_single_word_prefix_delim_Test
          (WordSplitSVTest_single_word_prefix_delim_Test<unsigned_char> *this)

{
  WordSplitSVTest_single_word_prefix_delim_Test<unsigned_char> *this_local;
  
  WordSplitSVTest<unsigned_char>::WordSplitSVTest(&this->super_WordSplitSVTest<unsigned_char>);
  *(undefined ***)&this->super_WordSplitSVTest<unsigned_char> =
       &PTR__WordSplitSVTest_single_word_prefix_delim_Test_008233a0;
  return;
}

Assistant:

TYPED_TEST(WordSplitSVTest, single_word_prefix_delim) {
	std::basic_string<TypeParam> word;
	word += default_delim<TypeParam>;
	word += make_word<TypeParam>();
	std::basic_string_view<TypeParam> single_word = word;
	std::vector<std::basic_string<TypeParam>> split_result = word_split(single_word, default_delim<TypeParam>);
	EXPECT_EQ(split_result.size(), 1);
	EXPECT_EQ(split_result[0].size(), 8);
}